

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

void lws_wsi_mux_dump_waiting_children(lws *wsi)

{
  lws *obj;
  lws_protocols *plVar1;
  char *pcVar2;
  undefined8 uVar3;
  
  if (wsi == (lws *)0x0) {
    pcVar2 = "[null wsi]";
  }
  else {
    pcVar2 = lws_lc_tag(&wsi->lc);
  }
  _lws_log(8,"%s: %s: children waiting for POLLOUT service:\n","lws_wsi_mux_dump_waiting_children",
           pcVar2);
  for (obj = (wsi->mux).child_list; obj != (lws *)0x0; obj = (obj->mux).sibling_list) {
    uVar3 = 0x2a;
    if ((obj->mux).requested_POLLOUT == '\0') {
      uVar3 = 0x20;
    }
    plVar1 = (obj->a).protocol;
    pcVar2 = "noprotocol";
    if (plVar1 != (lws_protocols *)0x0) {
      pcVar2 = plVar1->name;
    }
    _lws_log_cx((obj->lc).log_cx,lws_log_prepend_wsi,obj,8,"lws_wsi_mux_dump_waiting_children",
                "  %c sid %u: 0x%x %s %s",uVar3,(ulong)(obj->mux).my_sid,
                (ulong)(ushort)obj->wsistate,obj->role_ops->name,pcVar2);
  }
  return;
}

Assistant:

void
lws_wsi_mux_dump_waiting_children(struct lws *wsi)
{
#if defined(_DEBUG)
	lwsl_info("%s: %s: children waiting for POLLOUT service:\n",
		  __func__, lws_wsi_tag(wsi));

	wsi = wsi->mux.child_list;
	while (wsi) {
		lwsl_wsi_info(wsi, "  %c sid %u: 0x%x %s %s",
			  wsi->mux.requested_POLLOUT ? '*' : ' ',
			  wsi->mux.my_sid, lwsi_state(wsi),
			  wsi->role_ops->name,
			  wsi->a.protocol ? wsi->a.protocol->name : "noprotocol");

		wsi = wsi->mux.sibling_list;
	}
#endif
}